

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

FName __thiscall FMapInfoParser::CheckEndSequence(FMapInfoParser *this)

{
  bool bVar1;
  int iVar2;
  FString *this_00;
  FIntermissionAction *pFVar3;
  FMapInfoParser *in_RSI;
  FName local_4c;
  FIntermissionAction *local_48;
  FIntermissionAction *action;
  FIntermissionDescriptor *desc;
  FString local_28;
  FString seqname_1;
  char *seqname;
  FMapInfoParser *this_local;
  
  seqname_1.Chars = (char *)0x0;
  bVar1 = FScanner::Compare(&in_RSI->sc,"endgame");
  if (bVar1) {
    bVar1 = FScanner::CheckString(&in_RSI->sc,"{");
    if (bVar1) {
      ParseEndGame(this);
      goto LAB_003b8863;
    }
    FScanner::UnGet(&in_RSI->sc);
switchD_003b8530_caseD_34:
    seqname_1.Chars = "Inter_Pic3";
  }
  else {
    iVar2 = strncasecmp((in_RSI->sc).String,"EndGame",7);
    if (iVar2 == 0) {
      switch((in_RSI->sc).String[7]) {
      case '1':
        seqname_1.Chars = "Inter_Pic1";
        break;
      case '2':
        seqname_1.Chars = "Inter_Pic2";
        break;
      case '3':
        seqname_1.Chars = "Inter_Bunny";
        break;
      default:
        goto switchD_003b8530_caseD_34;
      case 'C':
        seqname_1.Chars = "Inter_Cast";
        break;
      case 'S':
        seqname_1.Chars = "Inter_Strife";
        break;
      case 'W':
        seqname_1.Chars = "Inter_Underwater";
      }
    }
    else {
      bVar1 = FScanner::Compare(&in_RSI->sc,"endpic");
      if (bVar1) {
        ParseComma(in_RSI);
        FScanner::MustGetString(&in_RSI->sc);
        FString::FString(&local_28);
        this_00 = FString::operator<<(&local_28,"@EndPic_");
        FString::operator<<(this_00,(in_RSI->sc).String);
        pFVar3 = (FIntermissionAction *)operator_new(0x18);
        FIntermissionDescriptor::FIntermissionDescriptor((FIntermissionDescriptor *)pFVar3);
        action = pFVar3;
        pFVar3 = (FIntermissionAction *)operator_new(0x60);
        FIntermissionAction::FIntermissionAction(pFVar3);
        local_48 = pFVar3;
        FString::operator=(&pFVar3->mBackground,(in_RSI->sc).String);
        TArray<FIntermissionAction_*,_FIntermissionAction_*>::Push
                  ((TArray<FIntermissionAction_*,_FIntermissionAction_*> *)&action->mSize,&local_48)
        ;
        FName::FName(&local_4c,&local_28);
        ReplaceIntermission(&local_4c,(FIntermissionDescriptor *)action);
        FName::FName((FName *)this,&local_28);
        FString::~FString(&local_28);
        goto LAB_003b8863;
      }
      bVar1 = FScanner::Compare(&in_RSI->sc,"endbunny");
      if (bVar1) {
        seqname_1.Chars = "Inter_Bunny";
      }
      else {
        bVar1 = FScanner::Compare(&in_RSI->sc,"endcast");
        if (bVar1) {
          seqname_1.Chars = "Inter_Cast";
        }
        else {
          bVar1 = FScanner::Compare(&in_RSI->sc,"enddemon");
          if (bVar1) {
            seqname_1.Chars = "Inter_Demonscroll";
          }
          else {
            bVar1 = FScanner::Compare(&in_RSI->sc,"endchess");
            if (bVar1) {
              seqname_1.Chars = "Inter_Chess";
            }
            else {
              bVar1 = FScanner::Compare(&in_RSI->sc,"endunderwater");
              if (bVar1) {
                seqname_1.Chars = "Inter_Underwater";
              }
              else {
                bVar1 = FScanner::Compare(&in_RSI->sc,"endbuystrife");
                if (bVar1) {
                  seqname_1.Chars = "Inter_BuyStrife";
                }
                else {
                  bVar1 = FScanner::Compare(&in_RSI->sc,"endtitle");
                  if (bVar1) {
                    seqname_1.Chars = "Inter_Titlescreen";
                  }
                  else {
                    bVar1 = FScanner::Compare(&in_RSI->sc,"endsequence");
                    if (bVar1) {
                      ParseComma(in_RSI);
                      FScanner::MustGetString(&in_RSI->sc);
                      seqname_1.Chars = (in_RSI->sc).String;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (seqname_1.Chars == (char *)0x0) {
    FName::FName((FName *)this,NAME_None);
  }
  else {
    FName::FName((FName *)this,seqname_1.Chars);
  }
LAB_003b8863:
  return (FName)(int)this;
}

Assistant:

FName FMapInfoParser::CheckEndSequence()
{
	const char *seqname = NULL;

	if (sc.Compare("endgame"))
	{
		if (!sc.CheckString("{"))
		{
			// Make Demon Eclipse work again
			sc.UnGet();
			goto standard_endgame;
		}
		return ParseEndGame();
	}
	else if (strnicmp (sc.String, "EndGame", 7) == 0)
	{
		switch (sc.String[7])
		{
		case '1':	seqname = "Inter_Pic1";		break;
		case '2':	seqname = "Inter_Pic2";		break;
		case '3':	seqname = "Inter_Bunny";	break;
		case 'C':	seqname = "Inter_Cast";		break;
		case 'W':	seqname = "Inter_Underwater";	break;
		case 'S':	seqname = "Inter_Strife";	break;
	standard_endgame:
		default:	seqname = "Inter_Pic3";		break;
		}
	}
	else if (sc.Compare("endpic"))
	{
		ParseComma();
		sc.MustGetString ();
		FString seqname;
		seqname << "@EndPic_" << sc.String;
		FIntermissionDescriptor *desc = new FIntermissionDescriptor;
		FIntermissionAction *action = new FIntermissionAction;
		action->mBackground = sc.String;
		desc->mActions.Push(action);
		ReplaceIntermission(seqname, desc);
		return FName(seqname);
	}
	else if (sc.Compare("endbunny"))
	{
		seqname = "Inter_Bunny";
	}
	else if (sc.Compare("endcast"))
	{
		seqname = "Inter_Cast";
	}
	else if (sc.Compare("enddemon"))
	{
		seqname = "Inter_Demonscroll";
	}
	else if (sc.Compare("endchess"))
	{
		seqname = "Inter_Chess";
	}
	else if (sc.Compare("endunderwater"))
	{
		seqname = "Inter_Underwater";
	}
	else if (sc.Compare("endbuystrife"))
	{
		seqname = "Inter_BuyStrife";
	}
	else if (sc.Compare("endtitle"))
	{
		seqname = "Inter_Titlescreen";
	}
	else if (sc.Compare("endsequence"))
	{
		ParseComma();
		sc.MustGetString();
		seqname = sc.String;
	}

	if (seqname != NULL)
	{
		return FName(seqname);
	}
	return NAME_None;
}